

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O3

int slu_mmdupd_(int_t *ehead,int *neqns,int_t *xadj,shortint *adjncy,int_t *delta,int_t *mdeg,
               shortint *dhead,int *dforw,int *dbakw,shortint *qsize,shortint *llist,
               shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint local_5c;
  uint local_50;
  
  local_50 = *ehead;
  if ((int)local_50 < 1) {
    return 0;
  }
  iVar1 = *delta;
  iVar2 = *mdeg;
  iVar7 = *tag;
LAB_0010e59e:
  iVar7 = iVar7 + iVar1 + iVar2;
  if (*maxint <= iVar7) {
    *tag = 1;
    uVar16 = *neqns;
    if ((int)uVar16 < 1) {
      iVar7 = 1;
    }
    else {
      uVar9 = 0;
      do {
        if (marker[uVar9] < *maxint) {
          marker[uVar9] = 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
      iVar7 = *tag;
    }
    iVar7 = iVar7 + iVar1 + iVar2;
  }
  uVar5 = (ulong)local_50;
  iVar10 = xadj[uVar5 - 1];
  iVar11 = xadj[uVar5];
  uVar9 = 0;
  local_5c = 0;
  iVar13 = 0;
  if (iVar10 < iVar11) {
    iVar13 = 0;
    local_5c = 0;
    uVar9 = 0;
    do {
      lVar12 = (long)iVar10;
      while( true ) {
        uVar8 = (uint)uVar9;
        uVar16 = adjncy[lVar12 + -1];
        lVar6 = (long)(int)uVar16;
        if (lVar6 < 0) break;
        if (uVar16 == 0) goto LAB_0010e6a0;
        if (qsize[lVar6 + -1] != 0) {
          iVar13 = qsize[lVar6 + -1] + iVar13;
          marker[lVar6 + -1] = iVar7;
          if (dbakw[lVar6 + -1] == 0) {
            if (dforw[lVar6 + -1] == 2) {
              uVar9 = (ulong)uVar16;
              uVar16 = local_5c;
              local_5c = uVar8;
            }
            llist[lVar6 + -1] = local_5c;
            local_5c = uVar16;
          }
        }
        lVar12 = lVar12 + 1;
        if (iVar11 <= lVar12) goto LAB_0010e6a0;
      }
      iVar10 = xadj[(ulong)-uVar16 - 1];
      iVar11 = xadj[-uVar16];
    } while (iVar10 < iVar11);
  }
LAB_0010e6a0:
  uVar8 = (uint)uVar9;
  uVar16 = local_5c;
  iVar10 = iVar13;
  if ((int)uVar8 < 1) goto LAB_0010e7ef;
  bVar4 = true;
  if (dbakw[uVar9 - 1] != 0) goto LAB_0010e905;
  *tag = *tag + 1;
  uVar16 = adjncy[(long)xadj[uVar9 - 1] + -1];
  if (uVar16 == local_50) {
    uVar16 = adjncy[xadj[uVar9 - 1]];
  }
  lVar12 = (long)(int)uVar16;
  if (dforw[lVar12 + -1] < 0) {
    iVar11 = xadj[lVar12 + -1];
    iVar17 = xadj[lVar12];
    if (iVar11 < iVar17) {
LAB_0010e71c:
      lVar12 = (long)iVar11;
      do {
        uVar16 = adjncy[lVar12 + -1];
        uVar14 = (ulong)uVar16;
        if (uVar16 != uVar8) {
          if ((int)uVar16 < 0) goto LAB_0010e7d5;
          if (uVar14 == 0) break;
          if (qsize[uVar14 - 1] != 0) {
            if (marker[uVar14 - 1] < *tag) {
              marker[uVar14 - 1] = *tag;
              iVar10 = iVar10 + qsize[uVar14 - 1];
            }
            else if (dbakw[uVar14 - 1] == 0) {
              if (dforw[uVar14 - 1] == 2) {
                qsize[uVar9 - 1] = qsize[uVar9 - 1] + qsize[uVar14 - 1];
                qsize[uVar14 - 1] = 0;
                marker[uVar14 - 1] = *maxint;
                dforw[uVar14 - 1] = -uVar8;
              }
              dbakw[uVar14 - 1] = -*maxint;
            }
          }
        }
        lVar12 = lVar12 + 1;
        if (iVar17 <= lVar12) break;
      } while( true );
    }
  }
  else {
    iVar10 = qsize[lVar12 + -1] + iVar13;
  }
LAB_0010e8b4:
  do {
    do {
      lVar12 = (long)iVar10 - (long)qsize[uVar9 - 1];
      iVar11 = (uint)lVar12 + 1;
      iVar10 = dhead[lVar12];
      dforw[uVar9 - 1] = iVar10;
      dbakw[uVar9 - 1] = ~(uint)lVar12;
      if (0 < (long)iVar10) {
        dbakw[(long)iVar10 + -1] = (shortint)uVar9;
      }
      dhead[lVar12] = (shortint)uVar9;
      if (iVar11 < *mdeg) {
        *mdeg = iVar11;
      }
LAB_0010e905:
      do {
        uVar16 = llist[uVar9 - 1];
        uVar9 = (ulong)uVar16;
        if (bVar4) goto LAB_0010e6a0;
LAB_0010e7ef:
        if ((int)uVar16 < 1) {
          *tag = iVar7;
          local_50 = llist[uVar5 - 1];
          if ((int)local_50 < 1) {
            return 0;
          }
          goto LAB_0010e59e;
        }
        uVar9 = (ulong)uVar16;
        bVar4 = false;
      } while (dbakw[uVar9 - 1] != 0);
      *tag = *tag + 1;
      lVar12 = (long)xadj[uVar9 - 1];
      iVar11 = xadj[uVar9];
      bVar4 = false;
      iVar10 = iVar13;
    } while (iVar11 <= xadj[uVar9 - 1]);
    do {
      uVar14 = (ulong)adjncy[lVar12 + -1];
      if (uVar14 == 0) break;
      if (marker[uVar14 - 1] < *tag) {
        marker[uVar14 - 1] = *tag;
        if (dforw[uVar14 - 1] < 0) {
          while( true ) {
            iVar17 = xadj[uVar14];
            if (iVar17 <= xadj[uVar14 - 1]) break;
            lVar6 = (long)xadj[uVar14 - 1];
            while( true ) {
              iVar3 = adjncy[lVar6 + -1];
              lVar15 = (long)iVar3;
              if (lVar15 < 0) break;
              if (iVar3 == 0) goto LAB_0010e89d;
              if (marker[lVar15 + -1] < *tag) {
                marker[lVar15 + -1] = *tag;
                iVar10 = iVar10 + qsize[lVar15 + -1];
              }
              lVar6 = lVar6 + 1;
              if (iVar17 <= lVar6) goto LAB_0010e89d;
            }
            uVar14 = (ulong)(uint)-iVar3;
          }
        }
        else {
          iVar10 = iVar10 + qsize[uVar14 - 1];
        }
      }
LAB_0010e89d:
      lVar12 = lVar12 + 1;
    } while (iVar11 != (int)lVar12);
  } while( true );
LAB_0010e7d5:
  iVar11 = xadj[(ulong)-uVar16 - 1];
  iVar17 = xadj[-uVar16];
  if (iVar17 <= iVar11) goto LAB_0010e8b4;
  goto LAB_0010e71c;
}

Assistant:

int slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt, 
	    istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
	return 0;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
	goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	enode = adjncy[i];
	link = -enode;
	if (enode < 0) {
	    goto L400;
	} else if (enode == 0) {
	    goto L800;
	} else {
	    goto L500;
	}

L500:
	if (qsize[enode] == 0) {
	    goto L700;
	}
	deg0 += qsize[enode];
	marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
	if (dbakw[enode] != 0) {
	    goto L700;
	}
/*                            --------------------------------------- 
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS. 
*/
/*                            --------------------------------------- 
*/
	if (dforw[enode] == 2) {
	    goto L600;
	}
	llist[enode] = qxhead;
	qxhead = enode;
	goto L700;
L600:
	llist[enode] = q2head;
	q2head = enode;
L700:
	;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
	goto L1500;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
	nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
	goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	node = adjncy[i];
	link = -node;
	if (node == enode) {
	    goto L1400;
	}
	if (node < 0) {
	    goto L1000;
	} else if (node == 0) {
	    goto L2100;
	} else {
	    goto L1100;
	}

L1100:
	if (qsize[node] == 0) {
	    goto L1400;
	}
	if (marker[node] >= *tag) {
	    goto L1200;
	}
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
	marker[node] = *tag;
	deg += qsize[node];
	goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
	if (dbakw[node] != 0) {
	    goto L1400;
	}
	if (dforw[node] != 2) {
	    goto L1300;
	}
	qsize[enode] += qsize[node];
	qsize[node] = 0;
	marker[node] = *maxint;
	dforw[node] = -enode;
	dbakw[node] = -(*maxint);
	goto L1400;
L1300:
/*                            -------------------------------------- 
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE. 
*/
/*                            -------------------------------------- 
*/
	if (dbakw[node] == 0) {
	    dbakw[node] = -(*maxint);
	}
L1400:
	;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
	goto L2300;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L2100;
	}
	if (marker[nabor] >= *tag) {
	    goto L2000;
	}
	marker[nabor] = *tag;
	link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
	if (dforw[nabor] < 0) {
	    goto L1700;
	}
	deg += qsize[nabor];
	goto L2000;
L1700:
/*                                    ------------------------------- 
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED 
*/
/*                                    NODES IN THIS ELEMENT INTO THE 
*/
/*                                    DEGREE COUNT. */
/*                                    ------------------------------- 
*/
	jstrt = xadj[link];
	jstop = xadj[link + 1] - 1;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    node = adjncy[j];
	    link = -node;
	    if (node < 0) {
		goto L1700;
	    } else if (node == 0) {
		goto L2000;
	    } else {
		goto L1800;
	    }

L1800:
	    if (marker[node] >= *tag) {
		goto L1900;
	    }
	    marker[node] = *tag;
	    deg += qsize[node];
L1900:
	    ;
	}
L2000:
	;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
	dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
	*mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
	goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}